

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

aiFace * __thiscall aiFace::operator=(aiFace *this,aiFace *o)

{
  uint uVar1;
  uint *__dest;
  ulong __n;
  
  if (o != this) {
    if (this->mIndices != (uint *)0x0) {
      operator_delete__(this->mIndices);
    }
    uVar1 = o->mNumIndices;
    this->mNumIndices = uVar1;
    if ((ulong)uVar1 == 0) {
      this->mIndices = (uint *)0x0;
    }
    else {
      __n = (ulong)uVar1 << 2;
      __dest = (uint *)operator_new__(__n);
      this->mIndices = __dest;
      memcpy(__dest,o->mIndices,__n);
    }
  }
  return this;
}

Assistant:

aiFace& operator = ( const aiFace& o) {
        if (&o == this) {
            return *this;
        }

        delete[] mIndices;
        mNumIndices = o.mNumIndices;
        if (mNumIndices) {
            mIndices = new unsigned int[mNumIndices];
            ::memcpy( mIndices, o.mIndices, mNumIndices * sizeof( unsigned int));
        } else {
            mIndices = nullptr;
        }

        return *this;
    }